

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::LinkFailure::Run(LinkFailure *this)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  CallLogWrapper *pCVar3;
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [36];
  uint local_dc;
  char *pcStack_d8;
  GLint res;
  char *varyings [2];
  GLuint local_c0;
  GLuint vsh;
  GLuint vbuf;
  GLuint vao;
  Vec4 v [4];
  allocator<char> local_61;
  string local_60 [32];
  long local_40;
  long error;
  GLuint sh2;
  GLuint sh1;
  char *src_vsh;
  char *src_fs;
  char *src_vs;
  LinkFailure *pLStack_10;
  GLuint program;
  LinkFailure *this_local;
  
  pCVar3 = &(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  pLStack_10 = this;
  src_vs._4_4_ = glu::CallLogWrapper::glCreateProgram(pCVar3);
  iVar2 = (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
            _vptr_GLWrapper[0x18])();
  src_fs = (char *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
            _vptr_GLWrapper[0x19])();
  src_vsh = (char *)CONCAT44(extraout_var_00,iVar2);
  iVar2 = (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
            _vptr_GLWrapper[0x1a])();
  _sh2 = (GLchar *)CONCAT44(extraout_var_01,iVar2);
  error._4_4_ = glu::CallLogWrapper::glCreateShader(pCVar3,0x8b31);
  glu::CallLogWrapper::glAttachShader(pCVar3,src_vs._4_4_,error._4_4_);
  glu::CallLogWrapper::glDeleteShader(pCVar3,error._4_4_);
  glu::CallLogWrapper::glShaderSource(pCVar3,error._4_4_,1,&src_fs,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(pCVar3,error._4_4_);
  error._0_4_ = glu::CallLogWrapper::glCreateShader(pCVar3,0x8b30);
  glu::CallLogWrapper::glAttachShader(pCVar3,src_vs._4_4_,(GLuint)error);
  glu::CallLogWrapper::glDeleteShader(pCVar3,(GLuint)error);
  glu::CallLogWrapper::glShaderSource(pCVar3,(GLuint)error,1,&src_vsh,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(pCVar3,(GLuint)error);
  glu::CallLogWrapper::glBindAttribLocation(pCVar3,src_vs._4_4_,0,"p");
  glu::CallLogWrapper::glBindAttribLocation(pCVar3,src_vs._4_4_,1,"posit");
  glu::CallLogWrapper::glBindFragDataLocation(pCVar3,src_vs._4_4_,0,"color");
  PIQBase::LinkProgram((PIQBase *)this,src_vs._4_4_);
  uVar1 = src_vs._4_4_;
  local_40 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_60,"posit",&local_61);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)uVar1,0x92e3,local_60,1,&local_40);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  pCVar3 = &(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  glu::CallLogWrapper::glUseProgram(pCVar3,src_vs._4_4_);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&vbuf,-1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(v[0].m_data + 2),-1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(v[1].m_data + 2),1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(v[2].m_data + 2),1.0,-1.0,0.0,1.0);
  glu::CallLogWrapper::glGenVertexArrays(pCVar3,1,&vsh);
  glu::CallLogWrapper::glBindVertexArray(pCVar3,vsh);
  glu::CallLogWrapper::glGenBuffers(pCVar3,1,&local_c0);
  glu::CallLogWrapper::glBindBuffer(pCVar3,0x8892,local_c0);
  glu::CallLogWrapper::glBufferData(pCVar3,0x8892,0x40,(Vector<float,_4> *)&vbuf,0x88e4);
  glu::CallLogWrapper::glVertexAttribPointer(pCVar3,0,4,0x1406,'\0',0x10,(void *)0x0);
  glu::CallLogWrapper::glEnableVertexAttribArray(pCVar3,0);
  glu::CallLogWrapper::glDrawArrays(pCVar3,5,0,4);
  glu::CallLogWrapper::glClear(pCVar3,0x4100);
  glu::CallLogWrapper::glDisableVertexAttribArray(pCVar3,0);
  glu::CallLogWrapper::glDeleteVertexArrays(pCVar3,1,&vsh);
  glu::CallLogWrapper::glBindBuffer(pCVar3,0x8892,0);
  glu::CallLogWrapper::glDeleteBuffers(pCVar3,1,&local_c0);
  glu::CallLogWrapper::glDetachShader(pCVar3,src_vs._4_4_,error._4_4_);
  varyings[1]._4_4_ = glu::CallLogWrapper::glCreateShader(pCVar3,0x8b31);
  glu::CallLogWrapper::glAttachShader(pCVar3,src_vs._4_4_,varyings[1]._4_4_);
  glu::CallLogWrapper::glDeleteShader(pCVar3,varyings[1]._4_4_);
  glu::CallLogWrapper::glShaderSource(pCVar3,varyings[1]._4_4_,1,(GLchar **)&sh2,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(pCVar3,varyings[1]._4_4_);
  pcStack_d8 = "q";
  varyings[0] = "z";
  glu::CallLogWrapper::glTransformFeedbackVaryings
            (pCVar3,src_vs._4_4_,2,&stack0xffffffffffffff28,0x8c8c);
  PIQBase::LinkProgram((PIQBase *)this,src_vs._4_4_);
  uVar1 = src_vs._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_100,"position",&local_101);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)uVar1,0x92e3,local_100,0xffffffff,&local_40);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&local_40);
  glu::CallLogWrapper::glGetProgramInterfaceiv
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,src_vs._4_4_,0x92e3,0x92f5,(GLint *)&local_dc);
  if ((local_dc != 0) && (local_dc != 1)) {
    anon_unknown_0::Output("Error, expected 0 or 1 active resources, got: %d",(ulong)local_dc);
    local_40 = -1;
  }
  glu::CallLogWrapper::glGetProgramInterfaceiv
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,src_vs._4_4_,0x92e3,0x92f6,(GLint *)&local_dc);
  if ((local_dc != 0) && (local_dc != 9)) {
    anon_unknown_0::Output("Error, expected 1 or 9 GL_MAX_NAME_LENGTH, got: %d",(ulong)local_dc);
    local_40 = -1;
  }
  uVar1 = src_vs._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_128,"color",&local_129);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)uVar1,0x92e4,local_128,0xffffffff,&local_40);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&local_40);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,src_vs._4_4_);
  return local_40;
}

Assistant:

virtual long Run()
	{
		const GLuint program = glCreateProgram();
		const char*  src_vs  = VertexShader_prop();
		const char*  src_fs  = FragmentShader_prop();
		const char*  src_vsh = VertexShader_fail();

		GLuint sh1 = glCreateShader(GL_VERTEX_SHADER);
		glAttachShader(program, sh1);
		glDeleteShader(sh1);
		glShaderSource(sh1, 1, &src_vs, NULL);
		glCompileShader(sh1);

		GLuint sh2 = glCreateShader(GL_FRAGMENT_SHADER);
		glAttachShader(program, sh2);
		glDeleteShader(sh2);
		glShaderSource(sh2, 1, &src_fs, NULL);
		glCompileShader(sh2);

		glBindAttribLocation(program, 0, "p");
		glBindAttribLocation(program, 1, "posit");
		glBindFragDataLocation(program, 0, "color");
		LinkProgram(program);

		long error = NO_ERROR;

		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "posit", 1, error);
		glUseProgram(program);

		tcu::Vec4 v[4] = { tcu::Vec4(-1, 1, 0, 1), tcu::Vec4(-1, -1, 0, 1), tcu::Vec4(1, 1, 0, 1),
						   tcu::Vec4(1, -1, 0, 1) };
		GLuint vao, vbuf;
		glGenVertexArrays(1, &vao);
		glBindVertexArray(vao);
		glGenBuffers(1, &vbuf);
		glBindBuffer(GL_ARRAY_BUFFER, vbuf);
		glBufferData(GL_ARRAY_BUFFER, sizeof(v), v, GL_STATIC_DRAW);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, sizeof(tcu::Vec4), 0);
		glEnableVertexAttribArray(0);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		glDisableVertexAttribArray(0);
		glDeleteVertexArrays(1, &vao);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glDeleteBuffers(1, &vbuf);

		glDetachShader(program, sh1);
		GLuint vsh = glCreateShader(GL_VERTEX_SHADER);
		glAttachShader(program, vsh);
		glDeleteShader(vsh);
		glShaderSource(vsh, 1, &src_vsh, NULL);
		glCompileShader(vsh);
		const char* varyings[2] = { "q", "z" };
		glTransformFeedbackVaryings(program, 2, varyings, GL_INTERLEAVED_ATTRIBS);
		LinkProgram(program);

		GLint res;
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "position", -1, error);
		ExpectError(GL_INVALID_OPERATION, error);
		glGetProgramInterfaceiv(program, GL_PROGRAM_INPUT, GL_ACTIVE_RESOURCES, &res);
		if (res != 0 && res != 1)
		{
			Output("Error, expected 0 or 1 active resources, got: %d", res);
			error = ERROR;
		}
		glGetProgramInterfaceiv(program, GL_PROGRAM_INPUT, GL_MAX_NAME_LENGTH, &res);
		if (res != 0 && res != 9)
		{
			Output("Error, expected 1 or 9 GL_MAX_NAME_LENGTH, got: %d", res);
			error = ERROR;
		}
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_OUTPUT, "color", -1, error);
		ExpectError(GL_INVALID_OPERATION, error);

		glDeleteProgram(program);
		return error;
	}